

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOCC-OTA-cs16btech11038.cpp
# Opt level: O1

int __thiscall FOCC_OTA::begin_trans(FOCC_OTA *this)

{
  int iVar1;
  Transaction *this_00;
  mapped_type *ppTVar2;
  int id;
  int local_2c;
  
  iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)&this->scheduler_lock);
  if (iVar1 != 0x23) {
    iVar1 = this->counter;
    local_2c = iVar1;
    this_00 = (Transaction *)operator_new(0xc0);
    Transaction::Transaction(this_00,iVar1,this->M);
    ppTVar2 = std::
              map<int,_Transaction_*,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
              ::operator[](&this->transactions,&local_2c);
    *ppTVar2 = this_00;
    this->counter = this->counter + 1;
    pthread_rwlock_unlock((pthread_rwlock_t *)&this->scheduler_lock);
    return local_2c;
  }
  std::__throw_system_error(0x23);
}

Assistant:

int FOCC_OTA::begin_trans() {
    scheduler_lock.lock();

    //if(transactions.size()>FOCC_OTA_GARB_THRESH) garbageCollect();

    int id = counter;
    transactions[id] = new Transaction(id, M);
    counter++;
    scheduler_lock.unlock();

    return id;
}